

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuilder.cpp
# Opt level: O2

void __thiscall
YAML::NodeBuilder::OnSequenceStart
          (NodeBuilder *this,Mark *mark,string *tag,anchor_t anchor,value style)

{
  node *this_00;
  
  this_00 = Push(this,mark,anchor);
  detail::node::set_tag(this_00,tag);
  detail::node::set_type(this_00,Sequence);
  detail::node::set_style(this_00,style);
  return;
}

Assistant:

void NodeBuilder::OnSequenceStart(const Mark& mark, const std::string& tag,
                                  anchor_t anchor, EmitterStyle::value style) {
  detail::node& node = Push(mark, anchor);
  node.set_tag(tag);
  node.set_type(NodeType::Sequence);
  node.set_style(style);
}